

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBuiltinPrecisionTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles3::Functional::createBuiltinPrecisionTests(Context *context)

{
  TestCaseGroup *this;
  ShaderType local_3c;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,context,"precision","Builtin precision tests");
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases();
  local_3c = SHADERTYPE_VERTEX;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_3c);
  local_3c = SHADERTYPE_FRAGMENT;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_3c);
  deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,
             es3Cases.
             super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
             .m_data.ptr,&shaderTypes,(TestCaseGroup *)this);
  de::details::
  UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~UniqueBase(&es3Cases.
                 super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
               );
  std::_Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~_Vector_base
            (&shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>);
  return this;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases	= bpt::createES3BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);
	return group;
}